

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densematrix.cc
# Opt level: O1

void __thiscall
fasttext::DenseMatrix::uniformThread(DenseMatrix *this,real a,int block,int32_t seed)

{
  undefined1 auVar1 [16];
  long lVar2;
  long lVar3;
  long lVar4;
  undefined1 auVar5 [16];
  undefined1 in_register_00001204 [60];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [16];
  minstd_rand rng;
  linear_congruential_engine<unsigned_long,_48271UL,_0UL,_2147483647UL> local_28;
  undefined1 extraout_var [56];
  
  auVar6._4_60_ = in_register_00001204;
  auVar6._0_4_ = a;
  local_28._M_x =
       (ulong)(long)(seed + block) % 0x7fffffff +
       (ulong)((ulong)(long)(seed + block) % 0x7fffffff == 0);
  lVar2 = (this->super_Matrix).n_ * (this->super_Matrix).m_;
  lVar3 = lVar2 / 10;
  lVar4 = lVar3 * block;
  lVar3 = (block + 1) * lVar3;
  if (lVar4 < lVar3 && lVar4 < lVar2) {
    auVar5._8_4_ = 0x80000000;
    auVar5._0_8_ = 0x8000000080000000;
    auVar5._12_4_ = 0x80000000;
    auVar5 = vxorps_avx512vl(auVar6._0_16_,auVar5);
    do {
      lVar2 = lVar4 + 1;
      auVar7._0_8_ = std::
                     generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,48271ul,0ul,2147483647ul>>
                               (&local_28);
      auVar7._8_56_ = extraout_var;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = (double)a - (double)auVar5._0_4_;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = (double)auVar5._0_4_;
      auVar1 = vfmadd213sd_fma(auVar7._0_16_,auVar8,auVar1);
      (this->data_).mem_[lVar4] = (float)auVar1._0_8_;
      if ((this->super_Matrix).n_ * (this->super_Matrix).m_ <= lVar2) {
        return;
      }
      lVar4 = lVar2;
    } while (lVar2 < lVar3);
  }
  return;
}

Assistant:

void DenseMatrix::uniformThread(real a, int block, int32_t seed) {
  std::minstd_rand rng(block + seed);
  std::uniform_real_distribution<> uniform(-a, a);
  int64_t blockSize = (m_ * n_) / 10;
  for (int64_t i = blockSize * block;
       i < (m_ * n_) && i < blockSize * (block + 1);
       i++) {
    data_[i] = uniform(rng);
  }
}